

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

Statistics *
deqp::gles2::Performance::anon_unknown_0::calculateStats
          (Statistics *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *samples)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double standardErrorOfMean;
  double x;
  double dStack_28;
  int i_1;
  double standardDeviation;
  double dStack_18;
  int i;
  double mean;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *samples_local;
  
  dStack_18 = 0.0;
  standardDeviation._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(samples);
    if ((int)sVar2 <= standardDeviation._4_4_) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (samples,(long)standardDeviation._4_4_);
    vVar1 = *pvVar3;
    auVar6._8_4_ = (int)(vVar1 >> 0x20);
    auVar6._0_8_ = vVar1;
    auVar6._12_4_ = 0x45300000;
    dStack_18 = (auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0) + dStack_18;
    standardDeviation._4_4_ = standardDeviation._4_4_ + 1;
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(samples);
  auVar9._8_4_ = (int)(sVar2 >> 0x20);
  auVar9._0_8_ = sVar2;
  auVar9._12_4_ = 0x45300000;
  dStack_18 = dStack_18 /
              ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  dStack_28 = 0.0;
  x._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(samples);
    if ((int)sVar2 <= x._4_4_) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (samples,(long)x._4_4_);
    vVar1 = *pvVar3;
    auVar7._8_4_ = (int)(vVar1 >> 0x20);
    auVar7._0_8_ = vVar1;
    auVar7._12_4_ = 0x45300000;
    dVar4 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
    dStack_28 = (dVar4 - dStack_18) * (dVar4 - dStack_18) + dStack_28;
    x._4_4_ = x._4_4_ + 1;
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(samples);
  auVar10._8_4_ = (int)(sVar2 >> 0x20);
  auVar10._0_8_ = sVar2;
  auVar10._12_4_ = 0x45300000;
  dVar4 = sqrt(dStack_28 /
               ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(samples);
  auVar8._8_4_ = (int)(sVar2 >> 0x20);
  auVar8._0_8_ = sVar2;
  auVar8._12_4_ = 0x45300000;
  dVar5 = sqrt((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  __return_storage_ptr__->mean = dStack_18;
  __return_storage_ptr__->standardDeviation = dVar4;
  __return_storage_ptr__->standardErrorOfMean = dVar4 / dVar5;
  return __return_storage_ptr__;
}

Assistant:

Statistics calculateStats (const vector<deUint64>& samples)
{
	double mean = 0.0;

	for (int i = 0; i < (int)samples.size(); i++)
		mean += (double)samples[i];

	mean /= (double)samples.size();

	double standardDeviation = 0.0;

	for (int i = 0; i < (int)samples.size(); i++)
	{
		double x = (double)samples[i];
		standardDeviation += (x - mean) * (x - mean);
	}

	standardDeviation /= (double)samples.size();
	standardDeviation = std::sqrt(standardDeviation);

	double standardErrorOfMean = standardDeviation / std::sqrt((double)samples.size());

	Statistics stats;

	stats.mean					= mean;
	stats.standardDeviation		= standardDeviation;
	stats.standardErrorOfMean	= standardErrorOfMean;

	return stats;
}